

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O0

int __thiscall
JsUtil::
Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::CacheStore::Add(CacheStore *this,EvalMapStringInternal<false> *key,FunctionInfo **value)

{
  int iVar1;
  bool local_39;
  undefined1 local_38 [8];
  AutoRestoreValue<bool> var;
  FunctionInfo **value_local;
  EvalMapStringInternal<false> *key_local;
  CacheStore *this_local;
  
  local_39 = true;
  var._16_8_ = value;
  Memory::AutoRestoreValue<bool>::AutoRestoreValue
            ((AutoRestoreValue<bool> *)local_38,&this->inAdd,&local_39);
  iVar1 = BaseDictionary<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Add(&this->super_TCacheStoreType,key,(FunctionInfo **)var._16_8_);
  Memory::AutoRestoreValue<bool>::~AutoRestoreValue((AutoRestoreValue<bool> *)local_38);
  return iVar1;
}

Assistant:

int Add(const TKey& key, const TValue& value)
            {
                AutoRestoreValue<bool> var(&this->inAdd, true);

                return __super::Add(key, value);
            }